

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_NewScArray<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  JavascriptArray *this_00;
  
  this_00 = JavascriptLibrary::CreateArrayLiteral
                      (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),(uint)playout->C1);
  JavascriptArray::CheckForceES5Array(this_00);
  SetReg<unsigned_char>(this,playout->R0,this_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScArray(const unaligned T * playout)
    {
        JavascriptArray *arr;
        arr = scriptContext->GetLibrary()->CreateArrayLiteral(playout->C1);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }